

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_boolean64_primitive_asInt64
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_boolean64_t value;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  value = sysbvm_tuple_boolean64_decode(*arguments);
  sVar1 = sysbvm_tuple_int64_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_boolean64_primitive_asInt64(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_int64_encode(context, sysbvm_tuple_boolean64_decode(arguments[0]));
}